

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O2

_Bool cs_reg_read(csh ud,cs_insn *insn,uint reg_id)

{
  cs_detail *arr;
  _Bool _Var1;
  
  if (ud != 0) {
    if (*(int *)(ud + 0x60) != 0) {
      if (insn->id == 0) {
        *(undefined4 *)(ud + 0x50) = 0xb;
        return false;
      }
      arr = insn->detail;
      if (arr != (cs_detail *)0x0) {
        _Var1 = arr_exist(arr->regs_read,arr->regs_read_count,reg_id);
        return _Var1;
      }
    }
    *(undefined4 *)(ud + 0x50) = 7;
  }
  return false;
}

Assistant:

CAPSTONE_API cs_reg_read(csh ud, const cs_insn *insn, unsigned int reg_id)
{
	struct cs_struct *handle;
	if (!ud)
		return false;

	handle = (struct cs_struct *)(uintptr_t)ud;

	if (!handle->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return false;
	}

	if (!insn->id) {
		handle->errnum = CS_ERR_SKIPDATA;
		return false;
	}

	if (!insn->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return false;
	}

	return arr_exist(insn->detail->regs_read, insn->detail->regs_read_count, reg_id);
}